

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>
::
transit_state<afsm::test::json_parser_def::context::array,afsm::test::json_parser_def::context::end,afsm::test::events::end_array,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context::array,afsm::test::events::end_array,afsm::none>,afsm::actions::detail::action_invocation<afsm::none,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context::array,afsm::test::json_parser_def::context::end>,afsm::transitions::detail::state_exit<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm___:state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
          (state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>
           *this,undefined8 event)

{
  event_process_result eVar1;
  undefined1 local_1;
  
  eVar1 = transit_state_impl<afsm::inner_state_machine<afsm::test::json_parser_def::context::array,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::state<afsm::test::json_parser_def::context::end,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>,afsm::test::events::end_array,afsm::actions::detail::guard_check<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context::array,afsm::test::events::end_array,afsm::none>,afsm::actions::detail::action_invocation<afsm::none,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observe___:state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>
                    (this,event,this + 0x50,this + 0x10,3,&local_1);
  return eVar1;
}

Assistant:

actions::event_process_result
    transit_state(Event&& event, Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear)
    {
        using source_index = ::psst::meta::index_of<SourceState, inner_states_def>;
        using target_index = ::psst::meta::index_of<TargetState, inner_states_def>;

        static_assert(source_index::found, "Failed to find source state index");
        static_assert(target_index::found, "Failed to find target state index");

        auto& source = ::std::get< source_index::value >(states_);
        auto& target = ::std::get< target_index::value >(states_);
        return transit_state_impl(
                ::std::forward<Event>(event), source, target,
                 guard, action, exit, enter, clear,
                 target_index::value,
                 typename def::traits::exception_safety<state_machine_definition_type>::type{});
    }